

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::LSTM_x86_fma::forward(LSTM_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _h;
  int iVar1;
  uint reverse;
  _func_int *p_Var2;
  int *piVar3;
  int iVar4;
  void *__src;
  size_t sVar5;
  ulong uVar6;
  void *__dest;
  bool bVar7;
  Mat m_2;
  Mat m_3;
  Mat m_6;
  int local_1cc;
  Mat m_7;
  Mat m_1;
  Mat m;
  Mat local_c8;
  Mat local_78;
  
  _h = bottom_blob->h;
  iVar1 = *(int *)(this->_vptr_LSTM_x86_fma[-3] + 0x40 + (long)&(this->weight_hc_data_packed).data);
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,
              *(int *)(this->_vptr_LSTM_x86_fma[-3] + 0x38 +
                      (long)&(this->weight_hc_data_packed).data),4,opt->workspace_allocator);
  iVar4 = -100;
  if ((local_78.data == (void *)0x0) || ((long)local_78.c * local_78.cstep == 0)) goto LAB_00392df3;
  if (0 < local_78.c * (int)local_78.cstep) {
    memset(local_78.data,0,(ulong)(uint)(local_78.c * (int)local_78.cstep) << 2);
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,
              *(int *)(this->_vptr_LSTM_x86_fma[-3] + 0x44 +
                      (long)&(this->weight_hc_data_packed).data),4,opt->workspace_allocator);
  iVar4 = -100;
  if ((local_c8.data != (void *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
    if (0 < local_c8.c * (int)local_c8.cstep) {
      memset(local_c8.data,0,(ulong)(uint)(local_c8.c * (int)local_c8.cstep) << 2);
    }
    Mat::create(top_blob,*(int *)(this->_vptr_LSTM_x86_fma[-3] + 0x38 +
                                 (long)&(this->weight_hc_data_packed).data) << (iVar1 == 2),_h,4,
                opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      reverse = *(uint *)(this->_vptr_LSTM_x86_fma[-3] + 0x40 +
                         (long)&(this->weight_hc_data_packed).data);
      if (reverse < 2) {
        m.w = (this->weight_xc_data_packed).w;
        m.h = (this->weight_xc_data_packed).h;
        m.c = (this->weight_xc_data_packed).d;
        m.data = (this->weight_xc_data_packed).data;
        uVar6 = (this->weight_xc_data_packed).elemsize;
        m.elempack = (this->weight_xc_data_packed).elempack;
        m.allocator = (this->weight_xc_data_packed).allocator;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (undefined4)uVar6;
        m.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
        m.d = 1;
        iVar1 = (this->weight_xc_data_packed).dims;
        m.dims = iVar1 + -1;
        m.cstep = (uVar6 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar6;
        if (iVar1 == 4) {
          m.cstep = (long)m.h * (long)m.w;
        }
        m_1.w = (this->bias_c_data_packed).w;
        m_1.h = (this->bias_c_data_packed).h;
        m_1.c = (this->bias_c_data_packed).d;
        m_1.data = (this->bias_c_data_packed).data;
        uVar6 = (this->bias_c_data_packed).elemsize;
        m_1.elempack = (this->bias_c_data_packed).elempack;
        m_1.allocator = (this->bias_c_data_packed).allocator;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = (undefined4)uVar6;
        m_1.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
        m_1.d = 1;
        iVar1 = (this->bias_c_data_packed).dims;
        m_1.dims = iVar1 + -1;
        m_1.cstep = (uVar6 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar6;
        if (iVar1 == 4) {
          m_1.cstep = (long)m_1.h * (long)m_1.w;
        }
        m_2.w = (this->weight_hc_data_packed).w;
        m_2.h = (this->weight_hc_data_packed).h;
        m_2.c = (this->weight_hc_data_packed).d;
        m_2.data = (this->weight_hc_data_packed).data;
        uVar6 = (this->weight_hc_data_packed).elemsize;
        m_2.elempack = (this->weight_hc_data_packed).elempack;
        m_2.allocator = (this->weight_hc_data_packed).allocator;
        m_2.refcount._0_4_ = 0;
        m_2.refcount._4_4_ = 0;
        m_2.elemsize._0_4_ = (undefined4)uVar6;
        m_2.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
        m_2.d = 1;
        sVar5 = (long)m_2.h * (long)m_2.w;
        iVar1 = (this->weight_hc_data_packed).dims;
        m_2.dims = iVar1 + -1;
        m_2.cstep = (uVar6 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar6;
        if (iVar1 == 4) {
          m_2.cstep = sVar5;
        }
        p_Var2 = this->_vptr_LSTM_x86_fma[-3];
        if (*(int *)(p_Var2 + 0x38 + (long)&(this->weight_hc_data_packed).data) ==
            *(int *)(p_Var2 + 0x44 + (long)&(this->weight_hc_data_packed).data)) {
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.allocator = (Allocator *)0x0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
        }
        else {
          m_3.w = *(int *)(&this->field_0x1e4 + (long)p_Var2);
          m_3.h = *(int *)(&this->field_0x1e8 + (long)p_Var2);
          m_3.c = *(int *)(&this->field_0x1ec + (long)p_Var2);
          m_3.data = *(void **)(&this->field_0x1b8 + (long)p_Var2);
          uVar6 = *(ulong *)(&this->field_0x1c8 + (long)p_Var2);
          m_3.elempack = *(int *)(&this->field_0x1d0 + (long)p_Var2);
          m_3.allocator = *(Allocator **)(&this->field_0x1d8 + (long)p_Var2);
          m_3.elemsize._0_4_ = (undefined4)uVar6;
          m_3.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
          m_3.d = 1;
          m_3.dims = *(int *)(&this->field_0x1e0 + (long)p_Var2) + -1;
          m_3.cstep = (uVar6 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar6;
          if (*(int *)(&this->field_0x1e0 + (long)p_Var2) == 4) {
            m_3.cstep = (long)m_3.h * (long)m_3.w;
          }
        }
        m_3.refcount._4_4_ = 0;
        m_3.refcount._0_4_ = 0;
        iVar4 = lstm(bottom_blob,top_blob,reverse,&m,&m_1,&m_2,&m_3,&local_78,&local_c8,opt);
        piVar3 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (m_3.allocator == (Allocator *)0x0) {
              if (m_3.data != (void *)0x0) {
                free(m_3.data);
              }
            }
            else {
              (*(m_3.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar3 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (m_2.allocator == (Allocator *)0x0) {
              if (m_2.data != (void *)0x0) {
                free(m_2.data);
              }
            }
            else {
              (*(m_2.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m_2.cstep = 0;
        m_2.data = (void *)0x0;
        m_2.refcount._0_4_ = 0;
        m_2.refcount._4_4_ = 0;
        m_2.elemsize._0_4_ = 0;
        m_2.elemsize._4_4_ = 0;
        m_2.elempack = 0;
        m_2.dims = 0;
        m_2.w = 0;
        m_2.h = 0;
        m_2.d = 0;
        m_2.c = 0;
        piVar3 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
        piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m.cstep = 0;
        m.data = (void *)0x0;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = 0;
        m.elemsize._4_4_ = 0;
        m.elempack = 0;
        m.dims = 0;
        m.w = 0;
        m.h = 0;
        m.d = 0;
        m.c = 0;
        local_1cc = iVar4;
        if (iVar4 != 0) goto LAB_00392d82;
      }
      if (*(int *)(this->_vptr_LSTM_x86_fma[-3] + 0x40 + (long)&(this->weight_hc_data_packed).data)
          == 2) {
        m.cstep = 0;
        m.data = (void *)0x0;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = 0;
        m.elemsize._4_4_ = 0;
        m.elempack = 0;
        m.allocator = (Allocator *)0x0;
        m.dims = 0;
        m.w = 0;
        m.h = 0;
        m.d = 0;
        m.c = 0;
        Mat::create(&m,*(int *)(this->_vptr_LSTM_x86_fma[-3] + 0x38 +
                               (long)&(this->weight_hc_data_packed).data),_h,4,
                    opt->workspace_allocator);
        iVar4 = -100;
        if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
          bVar7 = false;
        }
        else {
          m_1.cstep = 0;
          m_1.data = (void *)0x0;
          m_1.refcount._0_4_ = 0;
          m_1.refcount._4_4_ = 0;
          m_1.elemsize._0_4_ = 0;
          m_1.elemsize._4_4_ = 0;
          m_1.elempack = 0;
          m_1.allocator = (Allocator *)0x0;
          m_1.dims = 0;
          m_1.w = 0;
          m_1.h = 0;
          m_1.d = 0;
          m_1.c = 0;
          Mat::create(&m_1,*(int *)(this->_vptr_LSTM_x86_fma[-3] + 0x38 +
                                   (long)&(this->weight_hc_data_packed).data),_h,4,
                      opt->workspace_allocator);
          iVar4 = -100;
          if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
LAB_003929db:
            bVar7 = false;
          }
          else {
            m_2.w = (this->weight_xc_data_packed).w;
            m_2.h = (this->weight_xc_data_packed).h;
            m_2.c = (this->weight_xc_data_packed).d;
            m_2.data = (this->weight_xc_data_packed).data;
            uVar6 = (this->weight_xc_data_packed).elemsize;
            m_2.elempack = (this->weight_xc_data_packed).elempack;
            m_2.allocator = (this->weight_xc_data_packed).allocator;
            m_2.refcount._0_4_ = 0;
            m_2.refcount._4_4_ = 0;
            m_2.elemsize._0_4_ = (undefined4)uVar6;
            m_2.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_2.d = 1;
            sVar5 = (long)m_2.h * (long)m_2.w;
            iVar1 = (this->weight_xc_data_packed).dims;
            m_2.dims = iVar1 + -1;
            m_2.cstep = (uVar6 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar6;
            if (iVar1 == 4) {
              m_2.cstep = sVar5;
            }
            m_3.w = (this->bias_c_data_packed).w;
            m_3.h = (this->bias_c_data_packed).h;
            m_3.c = (this->bias_c_data_packed).d;
            m_3.data = (this->bias_c_data_packed).data;
            uVar6 = (this->bias_c_data_packed).elemsize;
            m_3.elempack = (this->bias_c_data_packed).elempack;
            m_3.allocator = (this->bias_c_data_packed).allocator;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = (undefined4)uVar6;
            m_3.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_3.d = 1;
            iVar1 = (this->bias_c_data_packed).dims;
            m_3.dims = iVar1 + -1;
            m_3.cstep = (uVar6 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar6;
            if (iVar1 == 4) {
              m_3.cstep = (long)m_3.h * (long)m_3.w;
            }
            m_6.w = (this->weight_hc_data_packed).w;
            m_6.h = (this->weight_hc_data_packed).h;
            m_6.c = (this->weight_hc_data_packed).d;
            m_6.data = (this->weight_hc_data_packed).data;
            uVar6 = (this->weight_hc_data_packed).elemsize;
            m_6.elempack = (this->weight_hc_data_packed).elempack;
            m_6.allocator = (this->weight_hc_data_packed).allocator;
            m_6.refcount._0_4_ = 0;
            m_6.refcount._4_4_ = 0;
            m_6.elemsize._0_4_ = (undefined4)uVar6;
            m_6.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_6.d = 1;
            sVar5 = (long)m_6.h * (long)m_6.w;
            iVar1 = (this->weight_hc_data_packed).dims;
            m_6.dims = iVar1 + -1;
            m_6.cstep = (uVar6 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar6;
            if (iVar1 == 4) {
              m_6.cstep = sVar5;
            }
            p_Var2 = this->_vptr_LSTM_x86_fma[-3];
            if (*(int *)(p_Var2 + 0x38 + (long)&(this->weight_hc_data_packed).data) ==
                *(int *)(p_Var2 + 0x44 + (long)&(this->weight_hc_data_packed).data)) {
              m_7.cstep = 0;
              m_7.data = (void *)0x0;
              m_7.elemsize._0_4_ = 0;
              m_7.elemsize._4_4_ = 0;
              m_7.elempack = 0;
              m_7.allocator = (Allocator *)0x0;
              m_7.dims = 0;
              m_7.w = 0;
              m_7.h = 0;
              m_7.d = 0;
              m_7.c = 0;
            }
            else {
              m_7.w = *(int *)(&this->field_0x1e4 + (long)p_Var2);
              m_7.h = *(int *)(&this->field_0x1e8 + (long)p_Var2);
              m_7.data = *(void **)(&this->field_0x1b8 + (long)p_Var2);
              uVar6 = *(ulong *)(&this->field_0x1c8 + (long)p_Var2);
              m_7.elempack = *(int *)(&this->field_0x1d0 + (long)p_Var2);
              m_7.allocator = *(Allocator **)(&this->field_0x1d8 + (long)p_Var2);
              m_7.elemsize._0_4_ = (undefined4)uVar6;
              m_7.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
              m_7.c = *(int *)(&this->field_0x1ec + (long)p_Var2);
              m_7.d = 1;
              m_7.dims = *(int *)(&this->field_0x1e0 + (long)p_Var2) + -1;
              m_7.cstep = (uVar6 * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) / uVar6;
              if (*(int *)(&this->field_0x1e0 + (long)p_Var2) == 4) {
                m_7.cstep = (long)m_7.h * (long)m_7.w;
              }
            }
            m_7.refcount._4_4_ = 0;
            m_7.refcount._0_4_ = 0;
            iVar4 = lstm(bottom_blob,&m,0,&m_2,&m_3,&m_6,&m_7,&local_78,&local_c8,opt);
            piVar3 = (int *)CONCAT44(m_7.refcount._4_4_,m_7.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (m_7.allocator == (Allocator *)0x0) {
                  if (m_7.data != (void *)0x0) {
                    free(m_7.data);
                  }
                }
                else {
                  (*(m_7.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            piVar3 = (int *)CONCAT44(m_6.refcount._4_4_,m_6.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (m_6.allocator == (Allocator *)0x0) {
                  if (m_6.data != (void *)0x0) {
                    free(m_6.data);
                  }
                }
                else {
                  (*(m_6.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_6.cstep = 0;
            m_6.data = (void *)0x0;
            m_6.refcount._0_4_ = 0;
            m_6.refcount._4_4_ = 0;
            m_6.elemsize._0_4_ = 0;
            m_6.elemsize._4_4_ = 0;
            m_6.elempack = 0;
            m_6.dims = 0;
            m_6.w = 0;
            m_6.h = 0;
            m_6.d = 0;
            m_6.c = 0;
            piVar3 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  if (m_3.data != (void *)0x0) {
                    free(m_3.data);
                  }
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
            piVar3 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (m_2.allocator == (Allocator *)0x0) {
                  if (m_2.data != (void *)0x0) {
                    free(m_2.data);
                  }
                }
                else {
                  (*(m_2.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_2.cstep = 0;
            m_2.data = (void *)0x0;
            m_2.refcount._0_4_ = 0;
            m_2.refcount._4_4_ = 0;
            m_2.elemsize._0_4_ = 0;
            m_2.elemsize._4_4_ = 0;
            m_2.elempack = 0;
            m_2.dims = 0;
            m_2.w = 0;
            m_2.h = 0;
            m_2.d = 0;
            m_2.c = 0;
            if (iVar4 != 0) goto LAB_003929db;
            if (0 < local_78.c * (int)local_78.cstep) {
              memset(local_78.data,0,(ulong)(uint)(local_78.c * (int)local_78.cstep) << 2);
            }
            if (0 < local_c8.c * (int)local_c8.cstep) {
              memset(local_c8.data,0,(ulong)(uint)(local_c8.c * (int)local_c8.cstep) << 2);
            }
            m_2.w = (this->weight_xc_data_packed).w;
            m_2.h = (this->weight_xc_data_packed).h;
            m_2.c = (this->weight_xc_data_packed).d;
            uVar6 = (this->weight_xc_data_packed).elemsize;
            m_2.data = (void *)((this->weight_xc_data_packed).cstep * uVar6 +
                               (long)(this->weight_xc_data_packed).data);
            m_2.elempack = (this->weight_xc_data_packed).elempack;
            m_2.allocator = (this->weight_xc_data_packed).allocator;
            m_2.refcount._0_4_ = 0;
            m_2.refcount._4_4_ = 0;
            m_2.elemsize._0_4_ = (undefined4)uVar6;
            m_2.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_2.d = 1;
            sVar5 = (long)m_2.h * (long)m_2.w;
            iVar1 = (this->weight_xc_data_packed).dims;
            m_2.dims = iVar1 + -1;
            m_2.cstep = (uVar6 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar6;
            if (iVar1 == 4) {
              m_2.cstep = sVar5;
            }
            m_3.w = (this->bias_c_data_packed).w;
            m_3.h = (this->bias_c_data_packed).h;
            m_3.c = (this->bias_c_data_packed).d;
            uVar6 = (this->bias_c_data_packed).elemsize;
            m_3.data = (void *)((this->bias_c_data_packed).cstep * uVar6 +
                               (long)(this->bias_c_data_packed).data);
            m_3.elempack = (this->bias_c_data_packed).elempack;
            m_3.allocator = (this->bias_c_data_packed).allocator;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = (undefined4)uVar6;
            m_3.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_3.d = 1;
            iVar1 = (this->bias_c_data_packed).dims;
            m_3.dims = iVar1 + -1;
            m_3.cstep = (uVar6 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar6;
            if (iVar1 == 4) {
              m_3.cstep = (long)m_3.h * (long)m_3.w;
            }
            m_6.w = (this->weight_hc_data_packed).w;
            m_6.h = (this->weight_hc_data_packed).h;
            m_6.c = (this->weight_hc_data_packed).d;
            uVar6 = (this->weight_hc_data_packed).elemsize;
            m_6.data = (void *)((this->weight_hc_data_packed).cstep * uVar6 +
                               (long)(this->weight_hc_data_packed).data);
            m_6.elempack = (this->weight_hc_data_packed).elempack;
            m_6.allocator = (this->weight_hc_data_packed).allocator;
            m_6.refcount._0_4_ = 0;
            m_6.refcount._4_4_ = 0;
            m_6.elemsize._0_4_ = (undefined4)uVar6;
            m_6.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_6.d = 1;
            sVar5 = (long)m_6.h * (long)m_6.w;
            iVar1 = (this->weight_hc_data_packed).dims;
            m_6.dims = iVar1 + -1;
            m_6.cstep = (uVar6 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar6;
            if (iVar1 == 4) {
              m_6.cstep = sVar5;
            }
            p_Var2 = this->_vptr_LSTM_x86_fma[-3];
            if (*(int *)(p_Var2 + 0x38 + (long)&(this->weight_hc_data_packed).data) ==
                *(int *)(p_Var2 + 0x44 + (long)&(this->weight_hc_data_packed).data)) {
              m_7.cstep = 0;
              m_7.data = (void *)0x0;
              m_7.elemsize._0_4_ = 0;
              m_7.elemsize._4_4_ = 0;
              m_7.elempack = 0;
              m_7.allocator = (Allocator *)0x0;
              m_7.dims = 0;
              m_7.w = 0;
              m_7.h = 0;
              m_7.d = 0;
              m_7.c = 0;
            }
            else {
              m_7.w = *(int *)(&this->field_0x1e4 + (long)p_Var2);
              m_7.h = *(int *)(&this->field_0x1e8 + (long)p_Var2);
              uVar6 = *(ulong *)(&this->field_0x1c8 + (long)p_Var2);
              m_7.data = (void *)(*(long *)(&this->field_0x1f8 + (long)p_Var2) * uVar6 +
                                 *(long *)(&this->field_0x1b8 + (long)p_Var2));
              m_7.elempack = *(int *)(&this->field_0x1d0 + (long)p_Var2);
              m_7.allocator = *(Allocator **)(&this->field_0x1d8 + (long)p_Var2);
              m_7.elemsize._0_4_ = (undefined4)uVar6;
              m_7.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
              m_7.c = *(int *)(&this->field_0x1ec + (long)p_Var2);
              m_7.d = 1;
              m_7.dims = *(int *)(&this->field_0x1e0 + (long)p_Var2) + -1;
              m_7.cstep = (uVar6 * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) / uVar6;
              if (*(int *)(&this->field_0x1e0 + (long)p_Var2) == 4) {
                m_7.cstep = (long)m_7.h * (long)m_7.w;
              }
            }
            m_7.refcount._4_4_ = 0;
            m_7.refcount._0_4_ = 0;
            iVar4 = lstm(bottom_blob,&m_1,1,&m_2,&m_3,&m_6,&m_7,&local_78,&local_c8,opt);
            piVar3 = (int *)CONCAT44(m_7.refcount._4_4_,m_7.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (m_7.allocator == (Allocator *)0x0) {
                  if (m_7.data != (void *)0x0) {
                    free(m_7.data);
                  }
                }
                else {
                  (*(m_7.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            piVar3 = (int *)CONCAT44(m_6.refcount._4_4_,m_6.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (m_6.allocator == (Allocator *)0x0) {
                  if (m_6.data != (void *)0x0) {
                    free(m_6.data);
                  }
                }
                else {
                  (*(m_6.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_6.cstep = 0;
            m_6.data = (void *)0x0;
            m_6.refcount._0_4_ = 0;
            m_6.refcount._4_4_ = 0;
            m_6.elemsize._0_4_ = 0;
            m_6.elemsize._4_4_ = 0;
            m_6.elempack = 0;
            m_6.dims = 0;
            m_6.w = 0;
            m_6.h = 0;
            m_6.d = 0;
            m_6.c = 0;
            piVar3 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  if (m_3.data != (void *)0x0) {
                    free(m_3.data);
                  }
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
            piVar3 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (m_2.allocator == (Allocator *)0x0) {
                  if (m_2.data != (void *)0x0) {
                    free(m_2.data);
                  }
                }
                else {
                  (*(m_2.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_2.cstep = 0;
            m_2.data = (void *)0x0;
            m_2.refcount._0_4_ = 0;
            m_2.refcount._4_4_ = 0;
            m_2.elemsize._0_4_ = 0;
            m_2.elemsize._4_4_ = 0;
            m_2.elempack = 0;
            m_2.dims = 0;
            m_2.w = 0;
            m_2.h = 0;
            m_2.d = 0;
            m_2.c = 0;
            bVar7 = iVar4 == 0;
            if ((bVar7) && (iVar4 = local_1cc, 0 < (int)_h)) {
              uVar6 = 0;
              do {
                __src = (void *)((long)m_1.w * uVar6 *
                                 CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                (long)m_1.data);
                __dest = (void *)((long)top_blob->w * uVar6 * top_blob->elemsize +
                                 (long)top_blob->data);
                memcpy(__dest,(void *)((long)m.w * uVar6 *
                                       CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                      (long)m.data),
                       (long)*(int *)(this->_vptr_LSTM_x86_fma[-3] + 0x38 +
                                     (long)&(this->weight_hc_data_packed).data) << 2);
                memcpy((void *)((long)__dest +
                               (long)*(int *)(this->_vptr_LSTM_x86_fma[-3] + 0x38 +
                                             (long)&(this->weight_hc_data_packed).data) * 4),__src,
                       (long)*(int *)(this->_vptr_LSTM_x86_fma[-3] + 0x38 +
                                     (long)&(this->weight_hc_data_packed).data) << 2);
                uVar6 = uVar6 + 1;
              } while (_h != uVar6);
            }
          }
          piVar3 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                if (m_1.data != (void *)0x0) {
                  free(m_1.data);
                }
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_1.cstep = 0;
          m_1.data = (void *)0x0;
          m_1.refcount._0_4_ = 0;
          m_1.refcount._4_4_ = 0;
          m_1.elemsize._0_4_ = 0;
          m_1.elemsize._4_4_ = 0;
          m_1.elempack = 0;
          m_1.dims = 0;
          m_1.w = 0;
          m_1.h = 0;
          m_1.d = 0;
          m_1.c = 0;
        }
        piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m.cstep = 0;
        m.data = (void *)0x0;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = 0;
        m.elemsize._4_4_ = 0;
        m.elempack = 0;
        m.dims = 0;
        m.w = 0;
        m.h = 0;
        m.d = 0;
        m.c = 0;
        if (!bVar7) goto LAB_00392d82;
      }
      iVar4 = 0;
    }
  }
LAB_00392d82:
  piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
LAB_00392df3:
  piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar4;
}

Assistant:

int LSTM_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;
    hidden.fill(0.f);

    Mat cell(hidden_size, 4u, opt.workspace_allocator);
    if (cell.empty())
        return -100;
    cell.fill(0.f);

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data_packed.channel(0), bias_c_data_packed.channel(0), weight_hc_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data_packed.channel(0), bias_c_data_packed.channel(0), weight_hc_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
        if (ret0 != 0)
            return ret0;

        hidden.fill(0.0f);
        cell.fill(0.0f);

        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data_packed.channel(1), bias_c_data_packed.channel(1), weight_hc_data_packed.channel(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden, cell, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}